

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::serializer(serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             *this,output_adapter_t<char> *s,char ichar,error_handler_t error_handler_)

{
  char cVar1;
  lconv *plVar2;
  undefined4 in_ECX;
  string *this_00;
  undefined1 in_DL;
  long in_RDI;
  shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>_>
  *in_stack_ffffffffffffff78;
  shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>_>
  *in_stack_ffffffffffffff80;
  char_type local_59;
  char_type local_49;
  allocator local_21;
  int local_20;
  int local_1c;
  undefined4 local_18;
  undefined1 local_11;
  
  local_18 = in_ECX;
  local_11 = in_DL;
  std::shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>_>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  memset((void *)(in_RDI + 0x10),0,0x40);
  plVar2 = localeconv();
  *(lconv **)(in_RDI + 0x50) = plVar2;
  if (*(long *)(*(long *)(in_RDI + 0x50) + 8) == 0) {
    local_49 = '\0';
  }
  else {
    local_1c = (int)**(char **)(*(long *)(in_RDI + 0x50) + 8);
    local_49 = std::char_traits<char>::to_char_type(&local_1c);
  }
  *(char_type *)(in_RDI + 0x58) = local_49;
  if (**(long **)(in_RDI + 0x50) == 0) {
    local_59 = '\0';
  }
  else {
    local_20 = (int)*(char *)**(undefined8 **)(in_RDI + 0x50);
    local_59 = std::char_traits<char>::to_char_type(&local_20);
  }
  *(char_type *)(in_RDI + 0x59) = local_59;
  memset((void *)(in_RDI + 0x5a),0,0x200);
  *(undefined1 *)(in_RDI + 0x25a) = local_11;
  this_00 = (string *)(in_RDI + 0x260);
  cVar1 = *(char *)(in_RDI + 0x25a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,0x200,cVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  *(undefined4 *)(in_RDI + 0x280) = local_18;
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar,
               error_handler_t error_handler_ = error_handler_t::strict)
        : o(std::move(s))
        , loc(std::localeconv())
        , thousands_sep(loc->thousands_sep == nullptr ? '\0' : std::char_traits<char>::to_char_type(* (loc->thousands_sep)))
        , decimal_point(loc->decimal_point == nullptr ? '\0' : std::char_traits<char>::to_char_type(* (loc->decimal_point)))
        , indent_char(ichar)
        , indent_string(512, indent_char)
        , error_handler(error_handler_)
    {}